

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  string local_290;
  string inputPage;
  picPageAnalyzer picAna;
  ifstream fin;
  byte abStack_1f8 [488];
  
  std::__cxx11::string::string((string *)&inputPage,"",(allocator *)&fin);
  std::ifstream::ifstream(&fin,"./testPic.html",_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while ((abStack_1f8[*(long *)(_fin + -0x18)] & 2) == 0) {
      std::istream::get();
      std::__cxx11::string::push_back((char)&inputPage);
    }
  }
  std::ifstream::close();
  picPageAnalyzer::picPageAnalyzer(&picAna,&inputPage);
  iVar2 = picPageAnalyzer::getCurrentPageNumber(&picAna);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  picPageAnalyzer::getPrevPageURL_abi_cxx11_(&local_290,&picAna);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_290);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_290);
  picPageAnalyzer::getNextPageURL_abi_cxx11_(&local_290,&picAna);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_290);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_290);
  picPageAnalyzer::getLossyPicSourceURL_abi_cxx11_(&local_290,&picAna);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_290);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_290);
  picPageAnalyzer::getOriginalPicSourceURL_abi_cxx11_(&local_290,&picAna);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_290);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_290);
  pageAnalyzer::~pageAnalyzer(&picAna.super_pageAnalyzer);
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&inputPage);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    std::string inputPage = std::string("");

    std::ifstream fin("./testPic.html", std::ios::in);
    if(fin.is_open())
    {
        while (!fin.eof())
            inputPage += fin.get();
    }
    fin.close();

    picPageAnalyzer picAna = picPageAnalyzer(inputPage);
    std::cout << picAna.getCurrentPageNumber() << std::endl;
    std::cout << picAna.getPrevPageURL() << std::endl;
    std::cout << picAna.getNextPageURL() << std::endl;
    std::cout << picAna.getLossyPicSourceURL() << std::endl;
    std::cout << picAna.getOriginalPicSourceURL() << std::endl;

    return 0;
}